

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringbuilder.h
# Opt level: O3

QByteArray * __thiscall
QStringBuilder<QStringBuilder<QByteArrayView_&,_char>,_QByteArray_&>::convertTo<QByteArray>
          (QByteArray *__return_storage_ptr__,
          QStringBuilder<QStringBuilder<QByteArrayView_&,_char>,_QByteArray_&> *this)

{
  char *pcVar1;
  char *__dest;
  QByteArrayView *pQVar2;
  size_t sVar3;
  qsizetype n;
  char *pcVar4;
  
  pcVar1 = (char *)(((this->a).a)->m_size + 1 + (this->b->d).size);
  (__return_storage_ptr__->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->d).ptr = &DAT_aaaaaaaaaaaaaaaa;
  QByteArray::QByteArray(__return_storage_ptr__,(longlong)pcVar1,Uninitialized);
  __dest = (__return_storage_ptr__->d).ptr;
  pQVar2 = (this->a).a;
  sVar3 = pQVar2->m_size;
  if (sVar3 != 0) {
    memcpy(__dest,pQVar2->m_data,sVar3);
  }
  pcVar4 = __dest + sVar3;
  *pcVar4 = (this->a).b;
  sVar3 = (this->b->d).size;
  if (sVar3 != 0) {
    memcpy(pcVar4 + 1,(this->b->d).ptr,sVar3);
  }
  if (pcVar1 != pcVar4 + 1 + (sVar3 - (long)__dest)) {
    QByteArray::resize((longlong)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

T convertTo() const
    {
        if (isNull()) {
            // appending two null strings must give back a null string,
            // so we're special casing this one out, QTBUG-114206
            return T();
        }

        const qsizetype len = Concatenable::size(*this);
        T s(len, Qt::Uninitialized);

        // Using data_ptr() here (private API) so we can bypass the
        // isDetached() and the replacement of a null pointer with _empty in
        // both QString and QByteArray's data() and constData(). The result is
        // the same if len != 0.
        auto d = reinterpret_cast<typename T::iterator>(s.data_ptr().data());
        const auto start = d;
        Concatenable::appendTo(*this, d);

        if constexpr (Concatenable::ExactSize) {
            Q_UNUSED(start)
        } else {
            if (len != d - start) {
                // this resize is necessary since we allocate a bit too much
                // when dealing with variable sized 8-bit encodings
                s.resize(d - start);
            }
        }
        return s;
    }